

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

size_t __thiscall Memory::HeapInfo::GetSmallHeapBlockCount(HeapInfo *this,bool checkCount)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  undefined8 *in_FS_OFFSET;
  size_t expectedHeapBlockCount;
  uint i_1;
  uint i;
  size_t currentSmallHeapBlockCount;
  bool checkCount_local;
  HeapInfo *this_local;
  
  _i_1 = 0;
  for (expectedHeapBlockCount._4_4_ = 0; expectedHeapBlockCount._4_4_ < 0x30;
      expectedHeapBlockCount._4_4_ = expectedHeapBlockCount._4_4_ + 1) {
    sVar3 = HeapBucketGroup<SmallAllocationBlockAttributes>::GetNonEmptyHeapBlockCount
                      (this->heapBuckets + expectedHeapBlockCount._4_4_,checkCount);
    sVar4 = HeapBucketGroup<SmallAllocationBlockAttributes>::GetEmptyHeapBlockCount
                      (this->heapBuckets + expectedHeapBlockCount._4_4_);
    _i_1 = sVar4 + sVar3 + _i_1;
  }
  for (expectedHeapBlockCount._0_4_ = 0; (uint)expectedHeapBlockCount < 0x1d;
      expectedHeapBlockCount._0_4_ = (uint)expectedHeapBlockCount + 1) {
    sVar3 = HeapBucketGroup<MediumAllocationBlockAttributes>::GetNonEmptyHeapBlockCount
                      (this->mediumHeapBuckets + (uint)expectedHeapBlockCount,checkCount);
    sVar4 = HeapBucketGroup<MediumAllocationBlockAttributes>::GetEmptyHeapBlockCount
                      (this->mediumHeapBuckets + (uint)expectedHeapBlockCount);
    _i_1 = sVar4 + sVar3 + _i_1;
  }
  sVar3 = HeapBlockList::Count<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>
                    (this->newLeafHeapBlockList);
  sVar4 = HeapBlockList::Count<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
                    (this->newNormalHeapBlockList);
  sVar5 = HeapBlockList::Count<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
                    (this->newFinalizableHeapBlockList);
  sVar6 = HeapBlockList::
          Count<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
                    (this->newNormalWithBarrierHeapBlockList);
  sVar7 = HeapBlockList::
          Count<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
                    (this->newFinalizableWithBarrierHeapBlockList);
  sVar8 = HeapBlockList::Count<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>
                    (this->newMediumLeafHeapBlockList);
  sVar9 = HeapBlockList::Count<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
                    (this->newMediumNormalHeapBlockList);
  sVar10 = HeapBlockList::Count<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
                     (this->newMediumFinalizableHeapBlockList);
  sVar11 = HeapBlockList::
           Count<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
                     (this->newMediumNormalWithBarrierHeapBlockList);
  sVar12 = HeapBlockList::
           Count<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
                     (this->newMediumFinalizableWithBarrierHeapBlockList);
  _i_1 = sVar12 + sVar11 + sVar10 + sVar9 + sVar8 + sVar7 + sVar6 + sVar5 + sVar4 + sVar3 + _i_1;
  if ((this->recycler != (Recycler *)0x0) &&
     (this->recycler->recyclerSweepManager != (RecyclerSweepManager *)0x0)) {
    bVar2 = RecyclerSweepManager::IsBackground(this->recycler->recyclerSweepManager);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                         ,0x68c,"(!this->recycler->recyclerSweepManager->IsBackground())",
                         "!this->recycler->recyclerSweepManager->IsBackground()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    sVar3 = RecyclerSweepManager::GetPendingMergeNewHeapBlockCount
                      (this->recycler->recyclerSweepManager,this);
    _i_1 = sVar3 + _i_1;
  }
  if ((checkCount) &&
     (_i_1 != this->heapBlockCount[4] + this->heapBlockCount[5] + this->heapBlockCount[9] +
              this->heapBlockCount[10] +
              this->heapBlockCount[1] + this->heapBlockCount[2] + this->heapBlockCount[3] +
              this->heapBlockCount[6] + this->heapBlockCount[7] + this->heapBlockCount[8])) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x6a6,
                       "(!checkCount || currentSmallHeapBlockCount == expectedHeapBlockCount)",
                       "!checkCount || currentSmallHeapBlockCount == expectedHeapBlockCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  return _i_1;
}

Assistant:

size_t
HeapInfo::GetSmallHeapBlockCount(bool checkCount) const
{
    size_t currentSmallHeapBlockCount = 0;
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        currentSmallHeapBlockCount += heapBuckets[i].GetNonEmptyHeapBlockCount(checkCount);
        currentSmallHeapBlockCount += heapBuckets[i].GetEmptyHeapBlockCount();
    }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && SMALLBLOCK_MEDIUM_ALLOC
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        currentSmallHeapBlockCount += mediumHeapBuckets[i].GetNonEmptyHeapBlockCount(checkCount);
        currentSmallHeapBlockCount += mediumHeapBuckets[i].GetEmptyHeapBlockCount();
    }
#endif

#if ENABLE_CONCURRENT_GC
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newLeafHeapBlockList);
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newNormalHeapBlockList);
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newFinalizableHeapBlockList);
#ifdef RECYCLER_VISITED_HOST
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newRecyclerVisitedHostHeapBlockList);
#endif
#ifdef RECYCLER_WRITE_BARRIER
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newNormalWithBarrierHeapBlockList);
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newFinalizableWithBarrierHeapBlockList);
#endif

    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumLeafHeapBlockList);
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumNormalHeapBlockList);
#ifdef RECYCLER_VISITED_HOST
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumRecyclerVisitedHostHeapBlockList);
#endif
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumFinalizableHeapBlockList);
#ifdef RECYCLER_WRITE_BARRIER
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumNormalWithBarrierHeapBlockList);
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumFinalizableWithBarrierHeapBlockList);
#endif

    // TODO: Update recycler sweep
    // Recycler can be null if we have OOM in the ctor
    if (this->recycler && this->recycler->recyclerSweepManager != nullptr)
    {
        // This function can't be called in the background
        Assert(!this->recycler->recyclerSweepManager->IsBackground());
        currentSmallHeapBlockCount += this->recycler->recyclerSweepManager->GetPendingMergeNewHeapBlockCount(this);
    }
#endif
#ifdef RECYCLER_SLOW_CHECK_ENABLED
    size_t expectedHeapBlockCount =
        this->heapBlockCount[HeapBlock::HeapBlockType::SmallNormalBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallLeafBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallFinalizableBlockType]
#ifdef RECYCLER_VISITED_HOST
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallRecyclerVisitedHostBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumRecyclerVisitedHostBlockType]
#endif
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumNormalBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumLeafBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumFinalizableBlockType];


#ifdef RECYCLER_WRITE_BARRIER
    expectedHeapBlockCount +=
        this->heapBlockCount[HeapBlock::HeapBlockType::SmallNormalBlockWithBarrierType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallFinalizableBlockWithBarrierType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumNormalBlockWithBarrierType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumFinalizableBlockWithBarrierType];

#endif
    Assert(!checkCount || currentSmallHeapBlockCount == expectedHeapBlockCount);
#endif

    return currentSmallHeapBlockCount;
}